

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qgraphicstransform.cpp
# Opt level: O3

int __thiscall QGraphicsRotation::qt_metacall(QGraphicsRotation *this,Call _c,int _id,void **_a)

{
  uint _id_00;
  
  _id_00 = QGraphicsTransform::qt_metacall((QGraphicsTransform *)this,_c,_id,_a);
  if ((int)_id_00 < 0) {
    return _id_00;
  }
  if (BindableProperty < _c) {
    return _id_00;
  }
  if ((0x14eU >> (_c & 0x1f) & 1) == 0) {
    if (_c != InvokeMetaMethod) {
      if (_c != RegisterMethodArgumentMetaType) {
        return _id_00;
      }
      if (_id_00 < 3) {
        *(undefined8 *)*_a = 0;
      }
      goto LAB_0062beca;
    }
    if (2 < _id_00) goto LAB_0062beca;
    _c = InvokeMetaMethod;
  }
  qt_static_metacall((QObject *)this,_c,_id_00,_a);
LAB_0062beca:
  return _id_00 - 3;
}

Assistant:

int QGraphicsRotation::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QGraphicsTransform::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 3)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 3)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 3;
    }
    if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 3;
    }
    return _id;
}